

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtch(fitsfile *gfptr,int grouptype,int *status)

{
  int iVar1;
  int *in_RDX;
  undefined4 in_ESI;
  bool bVar2;
  char comment [73];
  char keyvalue [71];
  char keyword [75];
  char tformBuff [54];
  char ttypeBuff [102];
  uchar charNull [1];
  char *ttype [6];
  char *tform [6];
  long tfields;
  long intNull;
  int j;
  int i;
  int grptype;
  int nrows;
  int colnum;
  int ncols;
  int uriCol;
  int locationCol;
  int positionCol;
  int extverCol;
  int extnameCol;
  int xtensionCol;
  long *in_stack_00006fe0;
  LONGLONG in_stack_00006fe8;
  uchar *in_stack_00006ff0;
  LONGLONG in_stack_00006ff8;
  undefined4 in_stack_00007000;
  int in_stack_00007004;
  fitsfile *in_stack_00007008;
  int in_stack_00007014;
  fitsfile *in_stack_00007018;
  int *in_stack_00007050;
  int *in_stack_00007060;
  long *status_00;
  long *tform_00;
  int *ttype_00;
  int *piVar3;
  fitsfile *in_stack_fffffffffffffd80;
  int *in_stack_fffffffffffffd98;
  int *in_stack_fffffffffffffda0;
  long *in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  fitsfile *in_stack_fffffffffffffdc0;
  int *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  int in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  int in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  int in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  fitsfile *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe20;
  char **in_stack_fffffffffffffe28;
  char **in_stack_fffffffffffffe30;
  int *in_stack_fffffffffffffe38;
  int *in_stack_fffffffffffffe40;
  int *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe84;
  fitsfile *in_stack_fffffffffffffe88;
  undefined1 local_138 [111];
  undefined1 local_c9;
  long local_c8 [6];
  long local_98 [7];
  long local_60;
  undefined8 local_58;
  int local_50;
  int local_4c;
  undefined4 local_48;
  int local_44;
  uint local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int *local_20;
  undefined4 local_14;
  int local_4;
  
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  local_58 = 0;
  local_60 = 0;
  local_20 = in_RDX;
  local_14 = in_ESI;
  memset(&local_c9,0,1);
  if (*local_20 == 0) {
    for (local_4c = 0; local_4c < 6; local_4c = local_4c + 1) {
      local_c8[local_4c] = (long)(local_138 + local_4c * 0x11);
      local_98[local_4c] = (long)(&stack0xfffffffffffffe88 + local_4c * 9);
    }
    iVar1 = ffgtgc(in_stack_fffffffffffffe18,
                   (int *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (int *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                   (int *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (int *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   in_stack_fffffffffffffdf0,(int *)in_stack_fffffffffffffe30,
                   in_stack_fffffffffffffe38,in_stack_fffffffffffffe40);
    *local_20 = iVar1;
    if (*local_20 == 0) {
      iVar1 = ffgkyj((fitsfile *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                     in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                     (char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      *local_20 = iVar1;
      ttype_00 = &local_3c;
      tform_00 = local_98;
      status_00 = local_c8;
      piVar3 = local_20;
      iVar1 = ffgtdc(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,
                     in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                     in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,in_stack_fffffffffffffe30,
                     in_stack_fffffffffffffe38,in_stack_fffffffffffffe40);
      *local_20 = iVar1;
      switch(local_14) {
      case 0:
        break;
      case 1:
        if (local_30 != 0) {
          iVar1 = ffdcol(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                         in_stack_fffffffffffffe78);
          *local_20 = iVar1;
          local_60 = local_60 + -1;
          if (local_30 < local_38) {
            local_38 = local_38 + -1;
          }
          if (local_30 < local_34) {
            local_34 = local_34 + -1;
          }
        }
        if (local_38 != 0) {
          iVar1 = ffdcol(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                         in_stack_fffffffffffffe78);
          *local_20 = iVar1;
          local_60 = local_60 + -1;
          if (local_38 < local_34) {
            local_34 = local_34 + -1;
          }
        }
        if (local_34 != 0) {
          iVar1 = ffdcol(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                         in_stack_fffffffffffffe78);
          *local_20 = iVar1;
        }
        break;
      case 2:
        if (local_24 != 0) {
          iVar1 = ffdcol(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                         in_stack_fffffffffffffe78);
          *local_20 = iVar1;
          local_60 = local_60 + -1;
          if (local_24 < local_28) {
            local_28 = local_28 + -1;
          }
          if (local_24 < local_2c) {
            local_2c = local_2c + -1;
          }
          if (local_24 < local_38) {
            local_38 = local_38 + -1;
          }
          if (local_24 < local_34) {
            local_34 = local_34 + -1;
          }
        }
        if (local_28 != 0) {
          iVar1 = ffdcol(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                         in_stack_fffffffffffffe78);
          *local_20 = iVar1;
          local_60 = local_60 + -1;
          if (local_28 < local_2c) {
            local_2c = local_2c + -1;
          }
          if (local_28 < local_38) {
            local_38 = local_38 + -1;
          }
          if (local_28 < local_34) {
            local_34 = local_34 + -1;
          }
        }
        if (local_2c != 0) {
          iVar1 = ffdcol(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                         in_stack_fffffffffffffe78);
          *local_20 = iVar1;
          local_60 = local_60 + -1;
          if (local_2c < local_38) {
            local_38 = local_38 + -1;
          }
          if (local_2c < local_34) {
            local_34 = local_34 + -1;
          }
        }
        if (local_38 != 0) {
          iVar1 = ffdcol(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                         in_stack_fffffffffffffe78);
          *local_20 = iVar1;
          local_60 = local_60 + -1;
          if (local_38 < local_34) {
            local_34 = local_34 + -1;
          }
        }
        if (local_34 != 0) {
          iVar1 = ffdcol(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                         in_stack_fffffffffffffe78);
          *local_20 = iVar1;
          local_60 = local_60 + -1;
        }
        break;
      case 3:
        if (local_38 != 0) {
          iVar1 = ffdcol(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                         in_stack_fffffffffffffe78);
          *local_20 = iVar1;
          local_60 = local_60 + -1;
          if (local_38 < local_34) {
            local_34 = local_34 + -1;
          }
        }
        if (local_34 != 0) {
          iVar1 = ffdcol(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                         in_stack_fffffffffffffe78);
          *local_20 = iVar1;
          local_60 = local_60 + -1;
        }
        break;
      default:
        *local_20 = 0x15b;
        ffpmsg((char *)0x1e649d);
        break;
      case 0xb:
        if (local_30 != 0) {
          iVar1 = ffdcol(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                         in_stack_fffffffffffffe78);
          *local_20 = iVar1;
          local_60 = local_60 + -1;
        }
        break;
      case 0xc:
        if (local_24 != 0) {
          iVar1 = ffdcol(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                         in_stack_fffffffffffffe78);
          *local_20 = iVar1;
          local_60 = local_60 + -1;
          if (local_24 < local_28) {
            local_28 = local_28 + -1;
          }
          if (local_24 < local_2c) {
            local_2c = local_2c + -1;
          }
        }
        if (local_28 != 0) {
          iVar1 = ffdcol(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                         in_stack_fffffffffffffe78);
          *local_20 = iVar1;
          local_60 = local_60 + -1;
          if (local_28 < local_2c) {
            local_2c = local_2c + -1;
          }
        }
        if (local_2c != 0) {
          iVar1 = ffdcol(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                         in_stack_fffffffffffffe78);
          *local_20 = iVar1;
          local_60 = local_60 + -1;
        }
      }
      local_4c = 0;
      while( true ) {
        bVar2 = false;
        if (local_4c < local_3c) {
          bVar2 = *local_20 == 0;
        }
        if (!bVar2) break;
        iVar1 = fficol(in_stack_fffffffffffffd80,(int)((ulong)piVar3 >> 0x20),(char *)ttype_00,
                       (char *)tform_00,(int *)status_00);
        *local_20 = iVar1;
        local_4c = local_4c + 1;
      }
      local_4c = 0;
      while( true ) {
        bVar2 = false;
        if (local_4c < local_3c) {
          bVar2 = *local_20 == 0;
        }
        if (!bVar2) break;
        iVar1 = fits_strcasecmp((char *)tform_00,(char *)status_00);
        if ((iVar1 == 0) ||
           (iVar1 = fits_strcasecmp((char *)tform_00,(char *)status_00), iVar1 == 0)) {
          iVar1 = ffgcno(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                         in_stack_fffffffffffffdb0,(int *)in_stack_fffffffffffffda8,
                         in_stack_fffffffffffffda0);
          *local_20 = iVar1;
          snprintf(&stack0xfffffffffffffe38,0x4b,"TFORM%d",(ulong)local_40);
          iVar1 = ffgkys((fitsfile *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                         in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
                         (char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
          *local_20 = iVar1;
          snprintf(&stack0xfffffffffffffe38,0x4b,"TNULL%d",(ulong)local_40);
          iVar1 = ffikyj(in_stack_fffffffffffffe18,
                         (char *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                         CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                         (char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                         (int *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          *local_20 = iVar1;
          local_50 = 1;
          while( true ) {
            bVar2 = false;
            if (local_50 <= local_44) {
              bVar2 = *local_20 == 0;
            }
            if (!bVar2) break;
            iVar1 = ffpclj(in_stack_00007008,in_stack_00007004,in_stack_00006ff8,
                           (LONGLONG)in_stack_00006ff0,in_stack_00006fe8,in_stack_00006fe0,
                           in_stack_00007050);
            *local_20 = iVar1;
            local_50 = local_50 + 1;
          }
        }
        else {
          iVar1 = fits_strcasecmp((char *)tform_00,(char *)status_00);
          if ((((iVar1 == 0) ||
               (iVar1 = fits_strcasecmp((char *)tform_00,(char *)status_00), iVar1 == 0)) ||
              (iVar1 = fits_strcasecmp((char *)tform_00,(char *)status_00), iVar1 == 0)) ||
             (iVar1 = fits_strcasecmp((char *)tform_00,(char *)status_00), iVar1 == 0)) {
            iVar1 = ffgcno(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                           in_stack_fffffffffffffdb0,(int *)in_stack_fffffffffffffda8,
                           in_stack_fffffffffffffda0);
            *local_20 = iVar1;
            local_50 = 1;
            while( true ) {
              bVar2 = false;
              if (local_50 <= local_44) {
                bVar2 = *local_20 == 0;
              }
              if (!bVar2) break;
              iVar1 = ffpclb(in_stack_00007018,in_stack_00007014,(LONGLONG)in_stack_00007008,
                             CONCAT44(in_stack_00007004,in_stack_00007000),in_stack_00006ff8,
                             in_stack_00006ff0,in_stack_00007060);
              *local_20 = iVar1;
              local_50 = local_50 + 1;
            }
          }
        }
        local_4c = local_4c + 1;
      }
    }
    local_4 = *local_20;
  }
  else {
    local_4 = *local_20;
  }
  return local_4;
}

Assistant:

int ffgtch(fitsfile *gfptr,     /* FITS pointer to group                     */
	   int       grouptype, /* code specifying the type of
				   grouping table information:
				   GT_ID_ALL_URI  0 ==> defualt (all columns)
				   GT_ID_REF      1 ==> ID by reference
				   GT_ID_POS      2 ==> ID by position
				   GT_ID_ALL      3 ==> ID by ref. and position
				   GT_ID_REF_URI 11 ==> (1) + URI info 
				   GT_ID_POS_URI 12 ==> (2) + URI info       */
	   int      *status)     /* return status code                       */


/* 
   Change the grouping table structure of the grouping table pointed to by
   gfptr. The grouptype code specifies the new structure of the table. This
   operation only adds or removes grouping table columns, it does not add
   or delete group members (i.e., table rows). If the grouping table already
   has the desired structure then no operations are performed and function   
   simply returns with a (0) success status code. If the requested structure
   change creates new grouping table columns, then the column values for all
   existing members will be filled with the appropriate null values.
*/

{
  int xtensionCol, extnameCol, extverCol, positionCol, locationCol, uriCol;
  int ncols    = 0;
  int colnum   = 0;
  int nrows    = 0;
  int grptype  = 0;
  int i,j;

  long intNull  = 0;
  long tfields  = 0;
  
  char *tform[6];
  char *ttype[6];

  unsigned char  charNull[1] = {'\0'};

  char ttypeBuff[102];  
  char tformBuff[54];  

  char  keyword[FLEN_KEYWORD];
  char  keyvalue[FLEN_VALUE];
  char  comment[FLEN_COMMENT];


  if(*status != 0) return(*status);

  do
    {
      /* set up the ttype and tform character buffers */

      for(i = 0; i < 6; ++i)
	{
	  ttype[i] = ttypeBuff+(i*17);
	  tform[i] = tformBuff+(i*9);
	}

      /* retrieve positions of all Grouping table reserved columns */

      *status = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,
		       &locationCol,&uriCol,&grptype,status);

      if(*status != 0) continue;

      /* determine the total number of grouping table columns */

      *status = fits_read_key_lng(gfptr,"TFIELDS",&tfields,comment,status);

      /* define grouping table columns to be added to the configuration */

      *status = ffgtdc(grouptype,xtensionCol,extnameCol,extverCol,positionCol,
		       locationCol,uriCol,ttype,tform,&ncols,status);

      /*
	delete any grouping tables columns that exist but do not belong to
	new desired configuration; note that we delete before creating new
	columns for (file size) efficiency reasons
      */

      switch(grouptype)
	{

	case GT_ID_ALL_URI:

	  /* no columns to be deleted in this case */

	  break;

	case GT_ID_REF:

	  if(positionCol != 0) 
	    {
	      *status = fits_delete_col(gfptr,positionCol,status);
	      --tfields;
	      if(uriCol      > positionCol)  --uriCol;
	      if(locationCol > positionCol) --locationCol;
	    }
	  if(uriCol      != 0)
	    { 
	    *status = fits_delete_col(gfptr,uriCol,status);
	      --tfields;
	      if(locationCol > uriCol) --locationCol;
	    }
	  if(locationCol != 0) 
	    *status = fits_delete_col(gfptr,locationCol,status);

	  break;

	case  GT_ID_POS:

	  if(xtensionCol != 0) 
	    {
	      *status = fits_delete_col(gfptr,xtensionCol,status);
	      --tfields;
	      if(extnameCol  > xtensionCol)  --extnameCol;
	      if(extverCol   > xtensionCol)  --extverCol;
	      if(uriCol      > xtensionCol)  --uriCol;
	      if(locationCol > xtensionCol)  --locationCol;
	    }
	  if(extnameCol  != 0) 
	    {
	      *status = fits_delete_col(gfptr,extnameCol,status);
	      --tfields;
	      if(extverCol   > extnameCol)  --extverCol;
	      if(uriCol      > extnameCol)  --uriCol;
	      if(locationCol > extnameCol)  --locationCol;
	    }
	  if(extverCol   != 0)
	    { 
	      *status = fits_delete_col(gfptr,extverCol,status);
	      --tfields;
	      if(uriCol      > extverCol)  --uriCol;
	      if(locationCol > extverCol)  --locationCol;
	    }
	  if(uriCol      != 0)
	    { 
	      *status = fits_delete_col(gfptr,uriCol,status);
	      --tfields;
	      if(locationCol > uriCol)  --locationCol;
	    }
	  if(locationCol != 0)
	    { 
	      *status = fits_delete_col(gfptr,locationCol,status);
	      --tfields;
	    }
	  
	  break;

	case  GT_ID_ALL:

	  if(uriCol      != 0) 
	    {
	      *status = fits_delete_col(gfptr,uriCol,status);
	      --tfields;
	      if(locationCol > uriCol)  --locationCol;
	    }
	  if(locationCol != 0)
	    { 
	      *status = fits_delete_col(gfptr,locationCol,status);
	      --tfields;
	    }

	  break;

	case GT_ID_REF_URI:

	  if(positionCol != 0)
	    { 
	      *status = fits_delete_col(gfptr,positionCol,status);
	      --tfields;
	    }

	  break;

	case  GT_ID_POS_URI:

	  if(xtensionCol != 0) 
	    {
	      *status = fits_delete_col(gfptr,xtensionCol,status);
	      --tfields;
	      if(extnameCol > xtensionCol)  --extnameCol;
	      if(extverCol  > xtensionCol)  --extverCol;
	    }
	  if(extnameCol  != 0)
	    { 
	      *status = fits_delete_col(gfptr,extnameCol,status);
	      --tfields;
	      if(extverCol > extnameCol)  --extverCol;
	    }
	  if(extverCol   != 0)
	    { 
	      *status = fits_delete_col(gfptr,extverCol,status);
	      --tfields;
	    }

	  break;

	default:

	  *status = BAD_OPTION;
	  ffpmsg("Invalid value for grouptype parameter specified (ffgtch)");
	  break;

	}

      /*
	add all the new grouping table columns that were not there
	previously but are called for by the grouptype parameter
      */

      for(i = 0; i < ncols && *status == 0; ++i)
	*status = fits_insert_col(gfptr,tfields+i+1,ttype[i],tform[i],status);

      /* 
	 add the TNULL keywords and values for each new integer column defined;
	 integer null values are zero (0) for the MEMBER_POSITION and 
	 MEMBER_VERSION columns. Insert a null ("/0") into each new string
	 column defined: MEMBER_XTENSION, MEMBER_NAME, MEMBER_URI_TYPE and
	 MEMBER_LOCATION. Note that by convention a null string is the
	 TNULL value for character fields so no TNULL is required.
      */

      for(i = 0; i < ncols && *status == 0; ++i)
	{	  
	  if(fits_strcasecmp(ttype[i],"MEMBER_POSITION") == 0 ||
	     fits_strcasecmp(ttype[i],"MEMBER_VERSION")  == 0)
	    {
	      /* col contains int data; set TNULL and insert 0 for each col */

	      *status = fits_get_colnum(gfptr,CASESEN,ttype[i],&colnum,
					status);
	      
	      snprintf(keyword,FLEN_KEYWORD,"TFORM%d",colnum);

	      *status = fits_read_key_str(gfptr,keyword,keyvalue,comment,
					  status);
	 
	      snprintf(keyword,FLEN_KEYWORD,"TNULL%d",colnum);

	      *status = fits_insert_key_lng(gfptr,keyword,0,
					    "Column Null Value",status);

	      for(j = 1; j <= nrows && *status == 0; ++j)
		*status = fits_write_col_lng(gfptr,colnum,j,1,1,&intNull,
					     status);
	    }
	  else if(fits_strcasecmp(ttype[i],"MEMBER_XTENSION") == 0 ||
		  fits_strcasecmp(ttype[i],"MEMBER_NAME")     == 0 ||
		  fits_strcasecmp(ttype[i],"MEMBER_URI_TYPE") == 0 ||
		  fits_strcasecmp(ttype[i],"MEMBER_LOCATION") == 0)
	    {

	      /* new col contains character data; insert NULLs into each col */

	      *status = fits_get_colnum(gfptr,CASESEN,ttype[i],&colnum,
					status);

	      for(j = 1; j <= nrows && *status == 0; ++j)
	    /* WILL THIS WORK FOR VAR LENTH CHAR COLS??????*/
		*status = fits_write_col_byt(gfptr,colnum,j,1,1,charNull,
					     status);
	    }
	}

    }while(0);

  return(*status);
}